

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<pstore::serialize::archive::void_type> *
testing::internal::ActionResultHolder<pstore::serialize::archive::void_type>::
PerformAction<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>
          (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *action,
          ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<pstore::serialize::archive::void_type> *pAVar1;
  tuple<pstore::gsl::span<int,__1L>_> local_30;
  ReferenceOrValueWrapper<pstore::serialize::archive::void_type> local_19;
  tuple<pstore::gsl::span<int,__1L>_> *local_18;
  ArgumentTuple *args_local;
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  pAVar1 = (ActionResultHolder<pstore::serialize::archive::void_type> *)operator_new(0x10);
  this = args_local;
  std::tuple<pstore::gsl::span<int,_-1L>_>::tuple(&local_30,local_18);
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Perform
            ((Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)this,
             &local_30);
  ReferenceOrValueWrapper<pstore::serialize::archive::void_type>::ReferenceOrValueWrapper(&local_19)
  ;
  ActionResultHolder(pAVar1);
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }